

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
flatbuffers::python::grpc::anon_unknown_0::BaseGenerator::BaseGenerator
          (BaseGenerator *this,Parser *parser,Config *config,string *path,Version *version)

{
  int16_t iVar1;
  Version *version_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  Config local_180;
  Version *local_30;
  Version *version_local;
  string *path_local;
  Config *config_local;
  Parser *parser_local;
  BaseGenerator *this_local;
  
  this->parser_ = parser;
  local_30 = version;
  version_local = (Version *)path;
  path_local = (string *)config;
  config_local = (Config *)parser;
  parser_local = (Parser *)this;
  WithFlagOptions(&local_180,config,&parser->opts,path);
  Keywords_abi_cxx11_(&local_1b0,(python *)local_30,version_00);
  IdlNamer::IdlNamer(&this->namer_,&local_180,&local_1b0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_1b0);
  Namer::Config::~Config(&local_180);
  iVar1 = local_30->minor;
  (this->version_).major = local_30->major;
  (this->version_).minor = iVar1;
  (this->version_).micro = local_30->micro;
  return;
}

Assistant:

BaseGenerator(const Parser &parser, const Namer::Config &config,
                const std::string &path, const Version &version)
      : parser_{parser},
        namer_{WithFlagOptions(config, parser.opts, path), Keywords(version)},
        version_{version} {}